

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cli.hpp
# Opt level: O2

void __thiscall Flag::Flag<char_const*,char_const*>(Flag *this,char *identifier,char *identifier_1)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_53;
  allocator<char> local_52;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  string local_30 [32];
  
  (this->super_Switch)._vptr_Switch = (_func_int **)&PTR_identifiers_abi_cxx11__0010e9a8;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,identifier,&local_51);
  std::__cxx11::string::string<std::allocator<char>>(local_30,identifier_1,&local_52);
  __l._M_len = 2;
  __l._M_array = &local_50;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->ids,__l,&local_53);
  lVar1 = 0x20;
  do {
    std::__cxx11::string::~string((string *)((long)&local_50._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  return;
}

Assistant:

explicit Flag(const T ...identifier) : ids { identifier... } {
        static_assert(sizeof...(T) >= 1, "At least one identifier must be provided");
    }